

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inquire.cpp
# Opt level: O3

size_t fs_get_blksize(string_view path)

{
  int iVar1;
  int *piVar2;
  string_view fname;
  stat s;
  statx sx;
  stat local_1a0;
  undefined1 local_110 [4];
  uint local_10c;
  
  iVar1 = statx(0xffffff9c,path._M_str,0x900,0x7ff,local_110);
  if (iVar1 == 0) {
    local_1a0.st_blksize = (__blksize_t)local_10c;
  }
  else {
    piVar2 = __errno_location();
    if ((*piVar2 != 0x26) || (iVar1 = stat(path._M_str,&local_1a0), iVar1 != 0)) {
      fname._M_str = "fs_get_blksize";
      fname._M_len = 0xe;
      fs_print_error(path,fname);
      local_1a0.st_blksize = 0;
    }
  }
  return local_1a0.st_blksize;
}

Assistant:

std::size_t fs_get_blksize(std::string_view path)
{
  // block size in bytes
#if defined(_WIN32)

  const std::string root = fs_root_name(path);
  if (root.empty())
    return {};

  const std::string wp = R"(\\.\)" + root;

  HANDLE h = CreateFileA(wp.data(), 0, 0, nullptr, OPEN_EXISTING, 0, nullptr);
  if (h != INVALID_HANDLE_VALUE) {
    DISK_GEOMETRY_EX diskGeometry = {};
    ZeroMemory(&diskGeometry, sizeof(DISK_GEOMETRY_EX));
    DWORD bytesReturned = 0;

    bool const ok = DeviceIoControl(h, IOCTL_DISK_GET_DRIVE_GEOMETRY_EX,
                        nullptr, 0, &diskGeometry, sizeof(diskGeometry),
                        &bytesReturned, nullptr);

    if (CloseHandle(h) && ok)  FFS_LIKELY
      return diskGeometry.Geometry.BytesPerSector;
  }

#else

  int r = 0;

#if defined(STATX_BASIC_STATS) && defined(USE_STATX)
  struct statx sx;
  r = statx(AT_FDCWD, path.data(), AT_NO_AUTOMOUNT | AT_SYMLINK_NOFOLLOW, STATX_BASIC_STATS, &sx);
  if (r == 0) FFS_LIKELY
    return sx.stx_blksize;
#endif

  if (r == 0 || errno == ENOSYS){
    if (struct stat s; !stat(path.data(), &s))
      return s.st_blksize;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}